

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O2

int nv_ckbios(uint8_t *data,int *length)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = nv_checksignature(data);
  if (iVar1 == 1) {
    uVar3 = (ulong)*(ushort *)(data + 0x18);
    uVar2 = (uint)data[uVar3 + 0x11] << 0x11 | (uint)data[uVar3 + 0x10] << 9;
    iVar1 = nv_cksum(data,uVar2);
    if (length != (int *)0x0) {
      *length = uVar2;
    }
    if (-1 < (char)data[uVar3 + 0x15]) {
      fwrite("Card has second bios\n",0x15,1,_stderr);
      uVar3 = (ulong)uVar2;
      iVar1 = nv_checksignature(data + uVar3);
      if (iVar1 == 1) {
        uVar2 = (uint)data[*(ushort *)(data + uVar3 + 0x18) + uVar3 + 0x11] << 0x11 |
                (uint)data[*(ushort *)(data + uVar3 + 0x18) + uVar3 + 0x10] << 9;
        iVar1 = nv_cksum(data + uVar3,uVar2);
        if (length != (int *)0x0) {
          *length = *length + uVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int nv_ckbios(const uint8_t *data, int *length)
{
	uint16_t pcir_ptr, pcir_ptr2;
	uint32_t ret = EUNK;
	int vbios_len, vbios2_len;

	ret = nv_checksignature(data);
	if (ret != EOK)
		return ret;

	pcir_ptr = data[0x18] | data[0x19] << 8;
	vbios_len = data[pcir_ptr + 0x10] * 512 + data[pcir_ptr + 0x11] * 512 * 256;
	ret = nv_cksum(data, vbios_len);
	if (length)
		*length = vbios_len;

	/* Check for a second vbios */
	if (!(data[pcir_ptr + 0x15] & 0x80)) {

		fprintf(stderr, "Card has second bios\n");

		ret = nv_checksignature(data + vbios_len);
		if (ret != EOK)
			return ret;

		pcir_ptr2 = data[vbios_len + 0x18] | data[vbios_len + 0x19] << 8;
		vbios2_len = data[vbios_len + pcir_ptr2 + 0x10] * 512 + data[vbios_len + pcir_ptr2 + 0x11] * 512 * 256;

		ret = nv_cksum(data + vbios_len, vbios2_len);

		if (length)
			*length += vbios2_len;
	}
	return ret;
}